

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

void __thiscall QToolButtonPrivate::popupTimerDone(QToolButtonPrivate *this)

{
  QWidget *parent;
  Data *pDVar1;
  void **ppvVar2;
  int *piVar3;
  QObject *pQVar4;
  PositionFunction positionFunction;
  bool bVar5;
  Orientation OVar6;
  long lVar7;
  QWidget *pQVar8;
  _Manager_type p_Var9;
  QToolBar *this_00;
  int *piVar10;
  undefined4 *puVar11;
  undefined8 uVar12;
  ulong uVar13;
  QWidget *pQVar14;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar15;
  char cVar16;
  undefined4 uVar17;
  QList<QAction_*> *this_01;
  QWidget *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  code *pcStack_90;
  QPoint initialPos;
  QArrayDataPointer<QAction_*> local_80;
  QObject local_68 [8];
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  anon_class_16_2_6d8a6aca local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  QBasicTimer::stop();
  if (((this->field_0x2ec & 4) == 0) &&
     (((this->super_QAbstractButtonPrivate).field_0x28c & 0x10) == 0)) goto LAB_004c35d8;
  this->field_0x2ec = this->field_0x2ec | 4;
  pDVar1 = (this->menuAction).wp.d;
  if ((pDVar1 == (Data *)0x0) ||
     ((*(int *)(pDVar1 + 4) == 0 || ((this->menuAction).wp.value == (QObject *)0x0)))) {
    if (this->defaultAction != (QAction *)0x0) {
      QAction::menuObject();
      lVar7 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (lVar7 != 0) goto LAB_004c308c;
    }
    pQVar8 = (QWidget *)operator_new(0x28);
    QMenu::QMenu((QMenu *)pQVar8,parent);
    p_Var9 = (_Manager_type)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar8);
    uVar17 = (undefined4)CONCAT71((int7)((ulong)p_Var9 >> 8),1);
    if ((this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.d.size != 0) {
      uVar13 = 0;
      do {
        QWidget::addAction(pQVar8,(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.
                                  d.ptr[uVar13]);
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.d.
                               size);
    }
  }
  else {
LAB_004c308c:
    QAction::menuObject();
    pQVar8 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (pQVar8 == (QWidget *)0x0) {
      p_Var9 = (_Manager_type)0x0;
    }
    else {
      p_Var9 = (_Manager_type)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar8);
    }
    uVar17 = 0;
  }
  bVar5 = QAbstractButton::autoRepeat((QAbstractButton *)parent);
  this->field_0x2ec = this->field_0x2ec & 0xef | bVar5 << 4;
  QAbstractButton::setAutoRepeat((QAbstractButton *)parent,false);
  this_00 = (QToolBar *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (this_00 == (QToolBar *)0x0) {
    uVar15 = CONCAT13(1,(int3)in_stack_ffffffffffffff28);
  }
  else {
    OVar6 = QToolBar::orientation(this_00);
    uVar15 = CONCAT13(OVar6 != Vertical,(int3)in_stack_ffffffffffffff28);
  }
  piVar10 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&parent->super_QObject);
  QMenu::setNoReplayFor((QMenu *)pQVar8,parent);
  if ((char)uVar17 == '\0') {
    if (p_Var9 == (_Manager_type)0x0) {
      pQVar14 = (QWidget *)0x0;
    }
    else {
      pQVar14 = (QWidget *)0x0;
      if (*(int *)(p_Var9 + 4) != 0) {
        pQVar14 = pQVar8;
      }
    }
    local_80.d = (Data *)QMenu::triggered;
    local_80.ptr = (QAction **)0x0;
    local_58 = onMenuTriggered;
    local_50 = (ImplFn)0x0;
    ppvVar2 = *(void ***)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
    puVar11 = (undefined4 *)operator_new(0x20);
    *puVar11 = 1;
    *(code **)(puVar11 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QToolButtonPrivate::*)(QAction_*),_QtPrivate::List<QAction_*>,_void>
         ::impl;
    *(code **)(puVar11 + 4) = onMenuTriggered;
    *(undefined8 *)(puVar11 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)pQVar14,(QObject *)&local_80,ppvVar2,(QSlotObjectBase *)&local_58,
               (ConnectionType)puVar11,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
  }
  if (p_Var9 == (_Manager_type)0x0) {
    pQVar14 = (QWidget *)0x0;
  }
  else {
    pQVar14 = (QWidget *)0x0;
    if (*(int *)(p_Var9 + 4) != 0) {
      pQVar14 = pQVar8;
    }
  }
  local_80.d = (Data *)QMenu::aboutToHide;
  local_80.ptr = (QAction **)0x0;
  local_58 = updateButtonDown;
  local_50 = (ImplFn)0x0;
  ppvVar2 = *(void ***)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  puVar11 = (undefined4 *)operator_new(0x20);
  *puVar11 = 1;
  *(code **)(puVar11 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QToolButtonPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar11 + 4) = updateButtonDown;
  *(undefined8 *)(puVar11 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar14,(QObject *)&local_80,ppvVar2,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar11,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  lVar7 = *(long *)&pQVar8->field_0x8;
  uVar12 = QtSharedPointer::ExternalRefCountData::getAndRef(&parent->super_QObject);
  piVar3 = *(int **)(lVar7 + 0x2f8);
  *(undefined8 *)(lVar7 + 0x2f8) = uVar12;
  *(QWidget **)(lVar7 + 0x300) = parent;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  pQVar4 = (QObject *)this->defaultAction;
  lVar7 = *(long *)&pQVar8->field_0x8;
  if (pQVar4 == (QObject *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar4);
  }
  piVar3 = *(int **)(lVar7 + 0x308);
  *(undefined8 *)(lVar7 + 0x308) = uVar12;
  *(QObject **)(lVar7 + 0x310) = pQVar4;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  QWidget::actions((QList<QAction_*> *)&local_80,parent);
  this_01 = &this->actionsCopy;
  QArrayDataPointer<QAction_*>::operator=(&this_01->d,&local_80);
  if (&(local_80.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d)->super_QArrayData,8,0x10);
    }
  }
  local_48._12_4_ = 0xaaaaaaaa;
  local_48._9_3_ = 0xaaaaaa;
  local_48.horizontal = SUB41((uint)uVar15 >> 0x18,0);
  initialPos = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pQVar14 = pQVar8;
  local_48.q = (QToolButton *)parent;
  local_80.d = (Data *)(**(code **)(*(long *)pQVar8 + 0x70))(pQVar8);
  initialPos = popupTimerDone::anon_class_16_2_6d8a6aca::operator()(&local_48,(QSize *)&local_80);
  uStack_a0 = CONCAT44(local_48._12_4_,local_48._8_4_);
  local_a8 = (QWidget *)local_48.q;
  pcStack_90 = std::
               _Function_handler<QPoint_(const_QSize_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qtoolbutton.cpp:781:29)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<QPoint_(const_QSize_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qtoolbutton.cpp:781:29)>
             ::_M_manager;
  positionFunction.super__Function_base._M_functor._4_4_ = uVar17;
  positionFunction.super__Function_base._M_functor._0_4_ = uVar15;
  positionFunction.super__Function_base._M_functor._8_8_ = pQVar14;
  positionFunction.super__Function_base._M_manager = p_Var9;
  positionFunction._M_invoker = (_Invoker_type)this_01;
  QMenuPrivate::exec(*(QMenuPrivate **)&pQVar8->field_0x8,&initialPos,(QAction *)0x0,
                     positionFunction);
  cVar16 = (char)uVar17;
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (piVar10 != (int *)0x0) {
    if (piVar10[1] != 0) {
      if (p_Var9 == (_Manager_type)0x0) {
        pQVar8 = (QWidget *)0x0;
      }
      else {
        pQVar8 = (QWidget *)0x0;
        if (*(int *)(p_Var9 + 4) != 0) {
          pQVar8 = pQVar14;
        }
      }
      local_80.d = (Data *)QMenu::aboutToHide;
      local_80.ptr = (QAction **)0x0;
      local_58 = updateButtonDown;
      local_50 = (ImplFn)0x0;
      QObject::disconnectImpl
                (&pQVar8->super_QObject,&local_80.d,
                 *(QObject **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8,
                 &local_58,&QMenu::staticMetaObject);
      if ((this->field_0x2ec & 4) != 0) {
        updateButtonDown(this);
      }
      if (cVar16 == '\0') {
        if (p_Var9 == (_Manager_type)0x0) {
          pQVar14 = (QWidget *)0x0;
        }
        else if (*(int *)(p_Var9 + 4) == 0) {
          pQVar14 = (QWidget *)0x0;
        }
        local_80.d = (Data *)QMenu::triggered;
        local_80.ptr = (QAction **)0x0;
        local_58 = onMenuTriggered;
        local_50 = (ImplFn)0x0;
        QObject::disconnectImpl
                  (&pQVar14->super_QObject,&local_80.d,
                   *(QObject **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8
                   ,&local_58,&QMenu::staticMetaObject);
      }
      else {
        if (p_Var9 == (_Manager_type)0x0) {
          pQVar14 = (QWidget *)0x0;
        }
        else if (*(int *)(p_Var9 + 4) == 0) {
          pQVar14 = (QWidget *)0x0;
        }
        if (pQVar14 != (QWidget *)0x0) {
          (**(code **)(*(long *)pQVar14 + 0x20))(pQVar14);
        }
      }
      QList<QAction_*>::clear(this_01);
      if ((this->field_0x2ec & 0x10) != 0) {
        QAbstractButton::setAutoRepeat((QAbstractButton *)parent,true);
      }
    }
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        operator_delete(piVar10);
      }
    }
  }
  if (p_Var9 != (_Manager_type)0x0) {
    LOCK();
    *(int *)p_Var9 = *(int *)p_Var9 + -1;
    UNLOCK();
    if (*(int *)p_Var9 == 0) {
      operator_delete(p_Var9);
    }
  }
LAB_004c35d8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolButtonPrivate::popupTimerDone()
{
    Q_Q(QToolButton);
    popupTimer.stop();
    if (!menuButtonDown && !down)
        return;

    menuButtonDown = true;
    QPointer<QMenu> actualMenu;
    bool mustDeleteActualMenu = false;
    if (menuAction) {
        actualMenu = menuAction->menu();
    } else if (defaultAction && defaultAction->menu()) {
        actualMenu = defaultAction->menu();
    } else {
        actualMenu = new QMenu(q);
        mustDeleteActualMenu = true;
        for (int i = 0; i < actions.size(); i++)
            actualMenu->addAction(actions.at(i));
    }
    repeat = q->autoRepeat();
    q->setAutoRepeat(false);
    bool horizontal = true;
#if QT_CONFIG(toolbar)
    QToolBar *tb = qobject_cast<QToolBar*>(parent);
    if (tb && tb->orientation() == Qt::Vertical)
        horizontal = false;
#endif
    QPointer<QToolButton> that = q;
    actualMenu->setNoReplayFor(q);
    if (!mustDeleteActualMenu) { //only if action are not in this widget
        QObjectPrivate::connect(actualMenu, &QMenu::triggered,
                                this, &QToolButtonPrivate::onMenuTriggered);
    }
    QObjectPrivate::connect(actualMenu, &QMenu::aboutToHide,
                            this, &QToolButtonPrivate::updateButtonDown);
    actualMenu->d_func()->causedPopup.widget = q;
    actualMenu->d_func()->causedPopup.action = defaultAction;
    actionsCopy = q->actions(); //(the list of action may be modified in slots)

    // QTBUG-78966, Delay positioning until after aboutToShow().
    auto positionFunction = [q, horizontal](const QSize &sizeHint) {
        return positionMenu(q, horizontal, sizeHint); };
    const auto initialPos = positionFunction(actualMenu->sizeHint());
    actualMenu->d_func()->exec(initialPos, nullptr, positionFunction);

    if (!that)
        return;

    QObjectPrivate::disconnect(actualMenu, &QMenu::aboutToHide,
                               this, &QToolButtonPrivate::updateButtonDown);
    if (menuButtonDown) {
        // The menu was empty, it didn't actually show up, so it was never hidden either
        updateButtonDown();
    }

    if (mustDeleteActualMenu) {
        delete actualMenu;
    } else {
        QObjectPrivate::disconnect(actualMenu, &QMenu::triggered,
                                   this, &QToolButtonPrivate::onMenuTriggered);
    }

    actionsCopy.clear();

    if (repeat)
        q->setAutoRepeat(true);
}